

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

int check_keyword(void)

{
  t_machine *ptVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  bool bVar5;
  
  ptVar1 = machine;
  piVar4 = &keyword[0].machine_type;
  uVar3 = 0;
  do {
    if ((*piVar4 == -1) || (ptVar1->type == *piVar4)) {
      iVar2 = strcasecmp(symbol,((anon_struct_16_3_aa3faf8f *)(piVar4 + -3))->name);
      if (iVar2 != 0) goto LAB_0010c40e;
      iVar2 = piVar4[-1];
    }
    else {
LAB_0010c40e:
      iVar2 = 0;
    }
    if (iVar2 != 0) break;
    piVar4 = piVar4 + 4;
    bVar5 = uVar3 < 9;
    uVar3 = uVar3 + 1;
  } while (bVar5);
  if (iVar2 != 0) {
    expr_lablptr = (t_symbol *)0x0;
    expr_lablcnt = 0;
  }
  return iVar2;
}

Assistant:

int
check_keyword(void)
{
	int op = 0;
	int i;
	/* check if its an assembler function */
	for(i=0; (0 == op) && (i<10); i++)
	{
		if(((MACHINE_ALL == keyword[i].machine_type) || (machine->type == keyword[i].machine_type)) && 
			(!strcasecmp(symbol, keyword[i].name)))
		{
			op = keyword[i].op;
		}
	}
	/* extra setup for functions that send back symbol infos */
	if(op)
	{
		expr_lablptr = NULL;
		expr_lablcnt = 0;
	}
	/* ok */
	return (op);
}